

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

bool __thiscall Moc::until(Moc *this,Token target)

{
  long lVar1;
  Symbol *pSVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  Token TVar14;
  
  lVar1 = (this->super_Parser).index;
  iVar4 = 0;
  if (lVar1 == 0) {
    iVar7 = 0;
    iVar11 = 0;
    iVar5 = 0;
  }
  else {
    uVar12 = (this->super_Parser).symbols.d.ptr[lVar1 + -1].token - LANGLE;
    iVar7 = 0;
    iVar11 = 0;
    iVar5 = 0;
    iVar4 = 0;
    if (uVar12 < 8) {
      uVar6 = (ulong)uVar12;
      iVar4 = *(int *)(&DAT_00143150 + uVar6 * 4);
      iVar7 = *(int *)(&DAT_00143170 + uVar6 * 4);
      iVar11 = *(int *)(&DAT_00143190 + uVar6 * 4);
      iVar5 = *(int *)(&DAT_001431b0 + uVar6 * 4);
    }
  }
  pSVar2 = (this->super_Parser).symbols.d.ptr;
  lVar1 = (this->super_Parser).symbols.d.size;
  lVar13 = -1;
  lVar8 = (this->super_Parser).index;
  do {
    if (lVar1 <= lVar8) goto LAB_00115b77;
    lVar9 = lVar8 + 1;
    (this->super_Parser).index = lVar9;
    TVar14 = pSVar2[lVar8].token;
    switch(TVar14) {
    case LANGLE:
      TVar14 = LANGLE;
      if (iVar11 == 0 && iVar4 == 0) {
        iVar5 = iVar5 + 1;
LAB_00115aa7:
        iVar4 = 0;
        iVar11 = 0;
      }
      break;
    case PP_RANGLE:
      TVar14 = PP_RANGLE;
      if (iVar11 == 0 && iVar4 == 0) {
        iVar5 = iVar5 + -1;
        goto LAB_00115aa7;
      }
      break;
    case LPAREN:
      iVar11 = iVar11 + 1;
      TVar14 = LPAREN;
      break;
    case PP_RPAREN:
      iVar11 = iVar11 + -1;
      TVar14 = PP_RPAREN;
      break;
    case ELIPSIS:
      break;
    case LBRACK:
      iVar7 = iVar7 + 1;
      TVar14 = LBRACK;
      break;
    case RBRACK:
      iVar7 = iVar7 + -1;
      TVar14 = RBRACK;
      break;
    case LBRACE:
      iVar4 = iVar4 + 1;
      TVar14 = LBRACE;
      break;
    case RBRACE:
      iVar4 = iVar4 + -1;
      TVar14 = RBRACE;
      break;
    default:
      if ((TVar14 == GTGT) && (TVar14 = GTGT, iVar11 == 0 && iVar4 == 0)) {
        iVar5 = iVar5 + -2;
        TVar14 = PP_RANGLE;
        goto LAB_00115aa7;
      }
    }
    lVar3 = lVar13;
    if (((((TVar14 != target) || (0 < iVar4)) || (0 < iVar7)) ||
        ((0 < iVar11 || ((target == PP_RANGLE && (0 < iVar5)))))) ||
       ((iVar10 = 1, target == COMMA && (lVar3 = lVar9, 0 < iVar5)))) {
      lVar13 = lVar3;
      if (((target == COMMA) && (TVar14 == EQ)) && (lVar13 != -1)) {
        (this->super_Parser).index = lVar13;
        iVar10 = 1;
        lVar9 = lVar13;
      }
      else if ((((iVar4 < 0) || (iVar7 < 0)) || (iVar11 < 0)) || (target == PP_RANGLE && iVar5 < 0))
      {
        (this->super_Parser).index = lVar8;
        iVar10 = 4;
        lVar9 = lVar8;
      }
      else {
        iVar10 = (uint)(TVar14 == SEMIC && iVar4 < 1) << 2;
      }
    }
    lVar8 = lVar9;
  } while (iVar10 == 0);
  if (iVar10 == 4) {
LAB_00115b77:
    if (target != COMMA) {
      return false;
    }
    if (iVar5 == 0) {
      return false;
    }
    if (lVar13 == -1) {
      return false;
    }
    (this->super_Parser).index = lVar13;
  }
  return true;
}

Assistant:

bool Moc::until(Token target) {
    int braceCount = 0;
    int brackCount = 0;
    int parenCount = 0;
    int angleCount = 0;
    if (index) {
        switch(symbols.at(index-1).token) {
        case LBRACE: ++braceCount; break;
        case LBRACK: ++brackCount; break;
        case LPAREN: ++parenCount; break;
        case LANGLE: ++angleCount; break;
        default: break;
        }
    }

    //when searching commas within the default argument, we should take care of template depth (anglecount)
    // unfortunately, we do not have enough semantic information to know if '<' is the operator< or
    // the beginning of a template type. so we just use heuristics.
    qsizetype possible = -1;

    while (index < symbols.size()) {
        Token t = symbols.at(index++).token;
        switch (t) {
        case LBRACE: ++braceCount; break;
        case RBRACE: --braceCount; break;
        case LBRACK: ++brackCount; break;
        case RBRACK: --brackCount; break;
        case LPAREN: ++parenCount; break;
        case RPAREN: --parenCount; break;
        case LANGLE:
            if (parenCount == 0 && braceCount == 0)
                ++angleCount;
          break;
        case RANGLE:
            if (parenCount == 0 && braceCount == 0)
                --angleCount;
          break;
        case GTGT:
            if (parenCount == 0 && braceCount == 0) {
                angleCount -= 2;
                t = RANGLE;
            }
            break;
        default: break;
        }
        if (t == target
            && braceCount <= 0
            && brackCount <= 0
            && parenCount <= 0
            && (target != RANGLE || angleCount <= 0)) {
            if (target != COMMA || angleCount <= 0)
                return true;
            possible = index;
        }

        if (target == COMMA && t == EQ && possible != -1) {
            index = possible;
            return true;
        }

        if (braceCount < 0 || brackCount < 0 || parenCount < 0
            || (target == RANGLE && angleCount < 0)) {
            --index;
            break;
        }

        if (braceCount <= 0 && t == SEMIC) {
            // Abort on semicolon. Allow recovering bad template parsing (QTBUG-31218)
            break;
        }
    }

    if (target == COMMA && angleCount != 0 && possible != -1) {
        index = possible;
        return true;
    }

    return false;
}